

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_flags nk_edit_string(nk_context *ctx,nk_flags flags,char *memory,int *len,int max,
                       nk_plugin_filter filter)

{
  undefined4 uVar1;
  int iVar2;
  code *str;
  int *in_RCX;
  long in_RDX;
  uint in_ESI;
  nk_plugin_filter in_RDI;
  int in_R8D;
  long in_R9;
  nk_flags unaff_retaddr;
  nk_context *in_stack_00000008;
  nk_window *win;
  nk_text_edit *edit;
  nk_flags state;
  nk_hash hash;
  void *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  nk_text_edit *state_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  nk_flags nVar3;
  
  if (((in_RDI == (nk_plugin_filter)0x0) || (in_RDX == 0)) || (in_RCX == (int *)0x0)) {
    nVar3 = 0;
  }
  else {
    if (in_R9 == 0) {
      in_R9 = 0;
    }
    state_00 = *(nk_text_edit **)(in_RDI + 0x40d8);
    iVar2._0_2_ = (state_00->undo).undo_rec[0x10].insert_length;
    iVar2._2_2_ = (state_00->undo).undo_rec[0x10].delete_length;
    str = in_RDI + 0x2b28;
    nk_textedit_clear_state
              (state_00,(nk_text_edit_type)((ulong)in_R9 >> 0x20),
               (nk_plugin_filter)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (((state_00->undo).undo_rec[0x11].where == 0) ||
       (iVar2 != (state_00->undo).undo_rec[0x10].where)) {
      str[0xb9] = (code)0x0;
    }
    else {
      if ((in_ESI & 0x10) == 0) {
        *(undefined4 *)(str + 0xa8) = *(undefined4 *)&(state_00->undo).undo_rec[0x11].char_storage;
      }
      else {
        iVar2 = nk_utf_len((char *)str,(int)((ulong)state_00 >> 0x20));
        *(int *)(str + 0xa8) = iVar2;
      }
      if ((in_ESI & 0x20) == 0) {
        *(undefined4 *)(str + 0xac) = *(undefined4 *)&(state_00->undo).undo_rec[0x11].char_storage;
        *(undefined4 *)(str + 0xb0) = *(undefined4 *)&(state_00->undo).undo_rec[0x11].char_storage;
      }
      else {
        *(int *)(str + 0xac) = (state_00->undo).undo_rec[0x12].where;
        *(undefined4 *)(str + 0xb0) = *(undefined4 *)&(state_00->undo).undo_rec[0x12].insert_length;
      }
      str[0xb4] = *(code *)&(state_00->undo).undo_rec[0x13].insert_length;
      *(float *)(str + 0xa0) = (float)*(uint *)&(state_00->undo).undo_rec[0x12].char_storage;
      *(float *)(str + 0xa4) = (float)(uint)(state_00->undo).undo_rec[0x13].where;
      str[0xb9] = (code)0x1;
    }
    if (in_R8D < 2) {
      in_R8D = 1;
    }
    if (*in_RCX < in_R8D + -1) {
      iVar2 = *in_RCX;
    }
    else {
      iVar2 = in_R8D + -1;
    }
    *in_RCX = iVar2;
    nk_str_init_fixed((nk_str *)CONCAT44(in_R8D,iVar2),in_stack_ffffffffffffff98,0x13c9bb);
    *(long *)(str + 0x70) = (long)*in_RCX;
    iVar2 = nk_utf_len((char *)str,(int)((ulong)state_00 >> 0x20));
    *(int *)(str + 0x90) = iVar2;
    nVar3 = nk_edit_buffer(in_stack_00000008,unaff_retaddr,
                           (nk_text_edit *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    *in_RCX = (int)*(undefined8 *)(str + 0x70);
    if (str[0xb9] != (code)0x0) {
      *(undefined4 *)&(state_00->undo).undo_rec[0x11].char_storage = *(undefined4 *)(str + 0xa8);
      (state_00->undo).undo_rec[0x12].where = *(int *)(str + 0xac);
      uVar1 = *(undefined4 *)(str + 0xb0);
      (state_00->undo).undo_rec[0x12].insert_length = (short)uVar1;
      (state_00->undo).undo_rec[0x12].delete_length = (short)((uint)uVar1 >> 0x10);
      *(code *)&(state_00->undo).undo_rec[0x13].insert_length = str[0xb4];
      *(int *)&(state_00->undo).undo_rec[0x12].char_storage = (int)(long)*(float *)(str + 0xa0);
      (state_00->undo).undo_rec[0x13].where = (int)(long)*(float *)(str + 0xa4);
    }
  }
  return nVar3;
}

Assistant:

NK_API nk_flags
nk_edit_string(struct nk_context *ctx, nk_flags flags,
char *memory, int *len, int max, nk_plugin_filter filter)
{
nk_hash hash;
nk_flags state;
struct nk_text_edit *edit;
struct nk_window *win;

NK_ASSERT(ctx);
NK_ASSERT(memory);
NK_ASSERT(len);
if (!ctx || !memory || !len)
return 0;

filter = (!filter) ? nk_filter_default: filter;
win = ctx->current;
hash = win->edit.seq;
edit = &ctx->text_edit;
nk_textedit_clear_state(&ctx->text_edit, (flags & NK_EDIT_MULTILINE)?
NK_TEXT_EDIT_MULTI_LINE: NK_TEXT_EDIT_SINGLE_LINE, filter);

if (win->edit.active && hash == win->edit.name) {
if (flags & NK_EDIT_NO_CURSOR)
edit->cursor = nk_utf_len(memory, *len);
else edit->cursor = win->edit.cursor;
if (!(flags & NK_EDIT_SELECTABLE)) {
edit->select_start = win->edit.cursor;
edit->select_end = win->edit.cursor;
} else {
edit->select_start = win->edit.sel_start;
edit->select_end = win->edit.sel_end;
}
edit->mode = win->edit.mode;
edit->scrollbar.x = (float)win->edit.scrollbar.x;
edit->scrollbar.y = (float)win->edit.scrollbar.y;
edit->active = nk_true;
} else edit->active = nk_false;

max = NK_MAX(1, max);
*len = NK_MIN(*len, max-1);
nk_str_init_fixed(&edit->string, memory, (nk_size)max);
edit->string.buffer.allocated = (nk_size)*len;
edit->string.len = nk_utf_len(memory, *len);
state = nk_edit_buffer(ctx, flags, edit, filter);
*len = (int)edit->string.buffer.allocated;

if (edit->active) {
win->edit.cursor = edit->cursor;
win->edit.sel_start = edit->select_start;
win->edit.sel_end = edit->select_end;
win->edit.mode = edit->mode;
win->edit.scrollbar.x = (nk_uint)edit->scrollbar.x;
win->edit.scrollbar.y = (nk_uint)edit->scrollbar.y;
} return state;
}